

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O1

JL_STATUS JlAddNumberU64ToDictionaryObject
                    (JlDataObject *DictionaryObject,char *KeyName,uint64_t NumberU64)

{
  JL_STATUS JVar1;
  JlDataObject *numberObject;
  JlDataObject *local_20;
  
  local_20 = (JlDataObject *)0x0;
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0) {
    JVar1 = JlCreateNumberU64Object(NumberU64,&local_20);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlAttachObjectToDictionaryObject(DictionaryObject,KeyName,local_20);
      if (JVar1 == JL_STATUS_SUCCESS) {
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&local_20);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlAddNumberU64ToDictionaryObject
    (
        JlDataObject*       DictionaryObject,   // [in,out]
        char const*         KeyName,            // [in]
        uint64_t            NumberU64           // [in]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* numberObject = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName )
    {
        jlStatus = JlCreateNumberU64Object( NumberU64, &numberObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, KeyName, numberObject );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                (void) JlFreeObjectTree( &numberObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}